

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommonTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLCommonTest_sizeInBytesReferenceTest_Test::TestBody
          (OpenDDLCommonTest_sizeInBytesReferenceTest_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  Text *this_00;
  Reference *pRVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  AssertHelper local_98;
  Message local_90;
  undefined4 local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Reference *ref2;
  Message local_60;
  uint local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  size_t size;
  Reference *ref1;
  Name *name;
  Text *local_18;
  Text *id;
  OpenDDLCommonTest_sizeInBytesReferenceTest_Test *this_local;
  
  id = (Text *)this;
  this_00 = (Text *)operator_new(0x18);
  Text::Text(this_00,"test",4);
  local_18 = this_00;
  pRVar3 = (Reference *)operator_new(0x10);
  Name::Name((Name *)pRVar3,GlobalName,local_18);
  ref1 = pRVar3;
  pRVar3 = (Reference *)operator_new(0x10);
  Reference::Reference(pRVar3,1,(Name **)&ref1);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Reference::sizeInBytes(pRVar3);
  local_54 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_50,"4U","size",&local_54,(unsigned_long *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar2) {
    testing::Message::Message(&local_60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ref2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
               ,0x90,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ref2,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ref2);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (pRVar3 != (Reference *)0x0) {
    Reference::~Reference(pRVar3);
    operator_delete(pRVar3,0x10);
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x10);
  Reference::Reference((Reference *)this_01,0,(Name **)0x0);
  gtest_ar_1.message_.ptr_ = this_01;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Reference::sizeInBytes((Reference *)this_01);
  local_84 = 0;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            ((char *)local_80,"0U",(uint *)"size",(unsigned_long *)&local_84,&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
               ,0x95,pcVar4);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  sVar1 = gtest_ar_1.message_;
  if (gtest_ar_1.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Reference::~Reference((Reference *)gtest_ar_1.message_.ptr_);
    operator_delete(sVar1.ptr_,0x10);
  }
  return;
}

Assistant:

TEST_F(OpenDDLCommonTest, sizeInBytesReferenceTest) {
    Text *id = new Text("test", 4);
    Name *name = new Name(GlobalName, id);
    Reference *ref1(new Reference(1, &name));
    size_t size(ref1->sizeInBytes());
    EXPECT_EQ(4U, size);
    delete ref1;

    Reference *ref2(new Reference(0, nullptr));
    size = ref2->sizeInBytes();
    EXPECT_EQ(0U, size);
    delete ref2;
}